

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

bool __thiscall ON_Matrix::IsRowOrthoNormal(ON_Matrix *this)

{
  uint uVar1;
  bool bVar2;
  double ***pppdVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  bVar2 = IsRowOrthoganal(this);
  if (bVar2) {
    uVar1 = this->m_row_count;
    pppdVar3 = &this->m;
    if (uVar1 == (this->m_rowmem).m_count) {
      pppdVar3 = &(this->m_rowmem).m_a;
    }
    if ((int)uVar1 < 1) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      uVar4 = 0;
      do {
        if (this->m_col_count < 1) {
          dVar6 = 0.0;
        }
        else {
          dVar6 = 0.0;
          uVar5 = 0;
          do {
            dVar6 = dVar6 + (*pppdVar3)[uVar4][uVar5] * (*pppdVar3)[uVar4][uVar5];
            uVar5 = uVar5 + 1;
          } while ((uint)this->m_col_count != uVar5);
        }
        bVar2 = (bool)(bVar2 & ABS(1.0 - dVar6) < 1.490116119385e-08);
        uVar4 = uVar4 + 1;
      } while (uVar4 != uVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ON_Matrix::IsRowOrthoNormal() const
{
  double d;
  int i, j;
  bool rc = IsRowOrthoganal();
  if ( rc ) {
    double const*const* this_m = ThisM();
    for ( i = 0; i < m_row_count; i++ ) {
      d = 0.0;
      for ( j = 0; j < m_col_count; j++ ) {
        d += this_m[i][j]*this_m[i][j];
      }
      if ( fabs(1.0-d) >=  ON_SQRT_EPSILON )
        rc = false;
    }
  }
  return rc;
}